

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

lys_node *
lys_node_dup_recursion
          (lys_module *module,lys_node *parent,lys_node *node,unres_schema *unres,int shallow,
          int finalize)

{
  uint8_t uVar1;
  LYS_NODE LVar2;
  lys_iffeature *plVar3;
  lys_node_list *plVar4;
  unres_schema *unres_00;
  byte bVar5;
  ushort uVar6;
  int iVar7;
  int iVar8;
  lys_node_list *plVar9;
  lys_node_list *plVar10;
  lys_node_list *child;
  char *pcVar11;
  lys_iffeature *plVar12;
  lys_restr *plVar13;
  lys_when *plVar14;
  uint8_t *__dest;
  lys_feature **pplVar15;
  lys_node *plVar16;
  lys_node_leaf **pplVar17;
  lys_node *plVar18;
  lys_unique *plVar19;
  char **ppcVar20;
  undefined8 *new_item;
  lys_node *plVar21;
  lys_module *plVar22;
  ushort uVar23;
  lys_node_list *plVar24;
  size_t __size;
  ly_ctx *plVar25;
  undefined8 uVar26;
  lys_node_list *plVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  lys_node **pplVar31;
  lys_module *module_00;
  long lVar32;
  int_log_opts local_a8;
  uint local_a4;
  int_log_opts prev_ilo;
  uint size1;
  lys_node *local_98;
  lys_node_list *list_orig;
  lys_node_list *local_88;
  uint local_7c;
  lys_node *plStack_78;
  uint size2;
  lys_node_list *local_70;
  lys_node_list *local_68;
  lys_node_list *local_60;
  int local_58;
  int local_54;
  unres_schema *local_50;
  lys_module *local_48;
  ly_ctx *local_40;
  lys_node *local_38;
  
  local_40 = module->ctx;
  LVar2 = node->nodetype;
  local_98 = node;
  plStack_78 = parent;
  local_48 = module;
  local_38 = node;
  switch(LVar2) {
  case LYS_CONTAINER:
    plVar24 = (lys_node_list *)calloc(1,0x90);
    local_88 = (lys_node_list *)0x0;
    local_60 = (lys_node_list *)0x0;
    local_70 = (lys_node_list *)0x0;
    local_68 = (lys_node_list *)0x0;
    plVar9 = (lys_node_list *)0x0;
    _prev_ilo = (lys_node_list *)0x0;
    child = plVar24;
    break;
  case LYS_CHOICE:
    local_88 = (lys_node_list *)calloc(1,0x78);
    plVar24 = (lys_node_list *)0x0;
    local_60 = (lys_node_list *)0x0;
    local_70 = (lys_node_list *)0x0;
    local_68 = (lys_node_list *)0x0;
    plVar9 = (lys_node_list *)0x0;
    _prev_ilo = (lys_node_list *)0x0;
    child = local_88;
    break;
  case LYS_CHOICE|LYS_CONTAINER:
  case LYS_LEAF|LYS_CONTAINER:
  case LYS_LEAF|LYS_CHOICE:
  case LYS_LEAF|LYS_CHOICE|LYS_CONTAINER:
switchD_0015b17d_caseD_3:
    child = (lys_node_list *)0x0;
    uVar26 = 0xc25;
    goto LAB_0015b1cc;
  case LYS_LEAF:
    local_60 = (lys_node_list *)calloc(1,0xd0);
    plVar24 = (lys_node_list *)0x0;
    local_88 = (lys_node_list *)0x0;
    local_70 = (lys_node_list *)0x0;
    local_68 = (lys_node_list *)0x0;
    plVar9 = (lys_node_list *)0x0;
    _prev_ilo = (lys_node_list *)0x0;
    child = local_60;
    break;
  case LYS_LEAFLIST:
    local_70 = (lys_node_list *)calloc(1,0xd8);
    plVar24 = (lys_node_list *)0x0;
    local_88 = (lys_node_list *)0x0;
    local_60 = (lys_node_list *)0x0;
    local_68 = (lys_node_list *)0x0;
    plVar9 = (lys_node_list *)0x0;
    _prev_ilo = (lys_node_list *)0x0;
    child = local_70;
    break;
  default:
    if (LVar2 == LYS_LIST) {
      local_68 = (lys_node_list *)calloc(1,0xa8);
      plVar24 = (lys_node_list *)0x0;
      local_88 = (lys_node_list *)0x0;
      local_60 = (lys_node_list *)0x0;
      local_70 = (lys_node_list *)0x0;
      plVar9 = (lys_node_list *)0x0;
      _prev_ilo = (lys_node_list *)0x0;
      child = local_68;
      break;
    }
    if (LVar2 == LYS_ANYXML) {
LAB_0015b14a:
      plVar9 = (lys_node_list *)calloc(1,0x80);
      plVar24 = (lys_node_list *)0x0;
      local_88 = (lys_node_list *)0x0;
      local_60 = (lys_node_list *)0x0;
      local_70 = (lys_node_list *)0x0;
      local_68 = (lys_node_list *)0x0;
      _prev_ilo = (lys_node_list *)0x0;
      child = plVar9;
      break;
    }
    if (LVar2 != LYS_CASE) {
      if (LVar2 == LYS_NOTIF) {
        __size = 0x80;
      }
      else {
        if (((LVar2 != LYS_RPC) && (LVar2 != LYS_INPUT)) && (LVar2 != LYS_OUTPUT)) {
          if (LVar2 == LYS_USES) {
            _prev_ilo = (lys_node_list *)calloc(1,0x88);
            plVar24 = (lys_node_list *)0x0;
            local_88 = (lys_node_list *)0x0;
            local_60 = (lys_node_list *)0x0;
            local_70 = (lys_node_list *)0x0;
            local_68 = (lys_node_list *)0x0;
            plVar9 = (lys_node_list *)0x0;
            child = _prev_ilo;
            break;
          }
          if (LVar2 != LYS_ACTION) {
            if (LVar2 != LYS_ANYDATA) goto switchD_0015b17d_caseD_3;
            goto LAB_0015b14a;
          }
        }
        __size = 0x78;
      }
      child = (lys_node_list *)calloc(1,__size);
      plVar24 = (lys_node_list *)0x0;
      local_88 = (lys_node_list *)0x0;
      local_60 = (lys_node_list *)0x0;
      local_70 = (lys_node_list *)0x0;
      local_68 = (lys_node_list *)0x0;
      plVar9 = (lys_node_list *)0x0;
      _prev_ilo = (lys_node_list *)0x0;
      break;
    }
    plVar10 = (lys_node_list *)calloc(1,0x70);
    plVar24 = (lys_node_list *)0x0;
    local_88 = (lys_node_list *)0x0;
    local_60 = (lys_node_list *)0x0;
    local_70 = (lys_node_list *)0x0;
    local_68 = (lys_node_list *)0x0;
    plVar9 = (lys_node_list *)0x0;
    _prev_ilo = (lys_node_list *)0x0;
    child = plVar10;
    goto LAB_0015b288;
  }
  plVar10 = (lys_node_list *)0x0;
LAB_0015b288:
  plVar21 = local_38;
  plVar25 = local_40;
  if (child == (lys_node_list *)0x0) {
    ly_log(local_40,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_node_dup_recursion");
    return (lys_node *)0x0;
  }
  local_58 = finalize;
  local_54 = shallow;
  pcVar11 = lydict_insert(local_40,local_38->name,0);
  child->name = pcVar11;
  pcVar11 = lydict_insert(plVar25,plVar21->dsc,0);
  child->dsc = pcVar11;
  pcVar11 = lydict_insert(plVar25,plVar21->ref,0);
  plVar22 = local_48;
  child->ref = pcVar11;
  child->flags = plVar21->flags;
  child->module = local_48;
  child->nodetype = plVar21->nodetype;
  child->prev = (lys_node *)child;
  iVar7 = unres_schema_find(unres,-1,&plVar21->ext,UNRES_EXT);
  if (iVar7 == -1) {
    uVar1 = plVar21->ext_size;
    child->ext_size = uVar1;
    iVar7 = lys_ext_dup(plVar25,plVar22,plVar21->ext,uVar1,child,LYEXT_PAR_NODE,&child->ext,local_54
                        ,unres);
    if (iVar7 != 0) goto LAB_0015bf6f;
  }
  bVar5 = plVar21->iffeature_size;
  if ((ulong)bVar5 == 0) {
LAB_0015b36b:
    plVar22 = local_48;
    iVar7 = local_54;
    if (local_54 == 0) {
      uVar28 = 0;
      list_orig = child;
      local_50 = unres;
      do {
        plVar25 = local_40;
        if (plVar21->iffeature_size <= uVar28) {
          uVar6 = 1;
          plVar21 = plStack_78;
          goto LAB_0015b9c8;
        }
        resolve_iffeature_getsizes(plVar21->iffeature + uVar28,&local_a4,&local_7c);
        plVar12 = child->iffeature;
        plVar21 = local_38;
        if (local_a4 != 0) {
          uVar29 = (ulong)((local_a4 & 3) != 0 || local_a4 >> 2 != 0);
          __dest = (uint8_t *)malloc(uVar29);
          plVar12[uVar28].expr = __dest;
          if (__dest == (uint8_t *)0x0) {
            ly_log(local_40,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "lys_node_dup_recursion");
            child = list_orig;
            break;
          }
          memcpy(__dest,local_38->iffeature[uVar28].expr,uVar29);
          uVar29 = (ulong)local_7c;
          pplVar15 = (lys_feature **)calloc(uVar29,8);
          plVar21 = local_38;
          plVar12[uVar28].features = pplVar15;
          if (pplVar15 == (lys_feature **)0x0) {
            ly_log(local_40,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "lys_node_dup_recursion");
            child = list_orig;
            free(list_orig->iffeature[uVar28].expr);
            break;
          }
          lVar32 = 0;
          for (uVar30 = 0; child = list_orig, uVar30 < uVar29; uVar30 = uVar30 + 1) {
            iVar7 = unres_schema_dup(local_48,local_50,
                                     (void *)((long)plVar21->iffeature[uVar28].features + lVar32),
                                     UNRES_IFFEAT,
                                     (void *)((long)list_orig->iffeature[uVar28].features + lVar32))
            ;
            if (iVar7 == 1) {
              *(undefined8 *)((long)child->iffeature[uVar28].features + lVar32) =
                   *(undefined8 *)((long)plVar21->iffeature[uVar28].features + lVar32);
            }
            else if (iVar7 == -1) goto LAB_0015bf6f;
            uVar29 = (ulong)local_7c;
            lVar32 = lVar32 + 8;
          }
          plVar12 = list_orig->iffeature;
          unres = local_50;
          iVar7 = local_54;
        }
        plVar3 = plVar21->iffeature;
        uVar1 = plVar3[uVar28].ext_size;
        plVar12[uVar28].ext_size = uVar1;
        iVar8 = lys_ext_dup(local_40,local_48,plVar3[uVar28].ext,uVar1,plVar12 + uVar28,
                            LYEXT_PAR_IFFEATURE,&plVar12[uVar28].ext,0,unres);
        uVar28 = uVar28 + 1;
        plVar21 = local_38;
      } while (iVar8 == 0);
      goto LAB_0015bf6f;
    }
    memcpy(child->iffeature,plVar21->iffeature,(ulong)child->iffeature_size << 5);
    plVar21 = local_38;
    plVar27 = _prev_ilo;
    goto LAB_0015b39c;
  }
  child->iffeature_size = bVar5;
  plVar12 = (lys_iffeature *)calloc((ulong)bVar5,0x20);
  child->iffeature = plVar12;
  plVar25 = local_40;
  plVar21 = local_38;
  if (plVar12 != (lys_iffeature *)0x0) goto LAB_0015b36b;
LAB_0015bf66:
  ly_log(plVar25,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_node_dup_recursion");
  goto LAB_0015bf6f;
  while (plVar21 = plVar16->prev, plVar16->prev != (lys_node *)0x0) {
LAB_0015b9c8:
    plVar16 = plVar21;
    if (plVar16 == (lys_node *)0x0) goto LAB_0015b9f9;
    if (plVar16->nodetype != LYS_AUGMENT) {
      if (plVar16->nodetype != LYS_USES) break;
      plVar21 = plVar16->parent;
      goto LAB_0015b9c8;
    }
  }
  uVar6 = plVar16->flags & 3;
LAB_0015b9f9:
  if (local_58 == 2) {
    uVar6 = child->flags & 0xfff8;
LAB_0015bbf8:
    child->flags = uVar6;
  }
  else if (local_58 == 1) {
    uVar23 = child->flags;
    if ((uVar23 & 4) == 0) {
      if (child->nodetype != LYS_USES) {
        uVar23 = uVar23 & 0xfff8 | uVar6;
        child->flags = uVar23;
      }
      uVar6 = plStack_78->flags & 0x38;
      if ((uVar23 & 0x38) < uVar6) {
        uVar6 = uVar6 | uVar23 & 0xffc7;
        goto LAB_0015bbf8;
      }
    }
    else if (((uVar6 & 2) != 0) && ((uVar23 & 1) != 0)) {
      ly_vlog(local_40,LYE_INARG,LY_VLOG_LYS,child,"true","config");
      ly_vlog(plVar25,LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
              "State nodes cannot have configuration nodes as children.");
      goto LAB_0015bf6f;
    }
  }
  iVar8 = lys_node_addchild(plStack_78,child->module,(lys_node *)child,0);
  if (iVar8 != 0) goto LAB_0015bf6f;
  plVar21 = local_38;
  plVar27 = _prev_ilo;
  if ((local_38->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
    pplVar31 = &local_38->child;
    while (plVar16 = *pplVar31, plVar16 != (lys_node *)0x0) {
      if (((plVar16->nodetype & LYS_GROUPING) == LYS_UNKNOWN) &&
         (plVar18 = lys_node_dup_recursion(local_48,(lys_node *)child,plVar16,unres,0,local_58),
         plVar21 = local_38, plVar27 = _prev_ilo, plVar18 == (lys_node *)0x0)) goto LAB_0015bf6f;
      pplVar31 = &plVar16->next;
    }
  }
  plVar22 = local_48;
  if ((((local_58 == 1) && (child->nodetype == LYS_LIST)) && ((child->flags & 1) != 0)) &&
     (plVar21->padding[2] == '\0')) {
    ly_vlog(local_40,LYE_MISSCHILDSTMT,LY_VLOG_LYS,child,"key","list");
    goto LAB_0015bf6f;
  }
LAB_0015b39c:
  plVar4 = local_68;
  LVar2 = plVar21->nodetype;
  switch(LVar2) {
  case LYS_CONTAINER:
    if ((lys_when *)plVar21[1].name != (lys_when *)0x0) {
      plVar14 = lys_when_dup(plVar22,(lys_when *)plVar21[1].name,iVar7,unres);
      plVar24->when = plVar14;
      plVar21 = local_38;
      if (plVar14 == (lys_when *)0x0) goto LAB_0015bf6f;
    }
    pplVar17 = (lys_node_leaf **)lydict_insert(local_40,*(char **)&plVar21[1].flags,0);
    plVar21 = local_38;
    plVar24->keys = pplVar17;
    if ((lys_restr *)local_38[1].dsc == (lys_restr *)0x0) {
      return (lys_node *)child;
    }
    plVar13 = lys_restr_dup(plVar22,(lys_restr *)local_38[1].dsc,(uint)local_38->padding[1],iVar7,
                            unres);
    plVar24->must = plVar13;
    if (plVar13 != (lys_restr *)0x0) {
      plVar24->tpdf_size = plVar21->padding[1];
      return (lys_node *)child;
    }
    goto LAB_0015bf6f;
  case LYS_CHOICE:
    if (*(lys_when **)plVar21->hash != (lys_when *)0x0) {
      plVar14 = lys_when_dup(plVar22,*(lys_when **)plVar21->hash,iVar7,unres);
      *(lys_when **)local_88->hash = plVar14;
      plVar21 = local_38;
      if (plVar14 == (lys_when *)0x0) goto LAB_0015bf6f;
    }
    plVar14 = (lys_when *)plVar21[1].name;
    if (iVar7 != 0) goto LAB_0015bd0e;
    if (plVar14 == (lys_when *)0x0) {
      unres_schema_dup(plVar22,unres,plVar21,UNRES_CHOICE_DFLT,local_88);
      return (lys_node *)child;
    }
    plVar22 = child->module;
    if ((plVar22->field_0x40 & 1) != 0) {
      plVar22 = (lys_module *)plVar22->data;
    }
    iVar7 = lys_get_sibling(local_88->child,plVar22->name,0,plVar14->cond,0,0x807d,
                            (lys_node **)&local_88->when);
    if (iVar7 == 0) {
      return (lys_node *)child;
    }
    uVar26 = 0xcda;
    break;
  case LYS_CHOICE|LYS_CONTAINER:
  case LYS_LEAF|LYS_CONTAINER:
  case LYS_LEAF|LYS_CHOICE:
  case LYS_LEAF|LYS_CHOICE|LYS_CONTAINER:
switchD_0015b697_caseD_3:
    uVar26 = 0xd86;
    break;
  case LYS_LEAF:
    plStack_78 = (lys_node *)&local_60->tpdf;
    iVar8 = lys_ingrouping((lys_node *)child);
    local_50 = unres;
    iVar8 = lys_type_dup(plVar22,(lys_node *)child,(lys_type *)plStack_78,
                         (lys_type *)&plVar21[1].ref,iVar8,iVar7,unres);
    plVar21 = local_38;
    unres_00 = local_50;
    if (iVar8 != 0) goto LAB_0015bf6f;
    plVar16 = (lys_node *)lydict_insert(local_48->ctx,(char *)local_38[1].next,0);
    *(lys_node **)&local_60[1].flags = plVar16;
    if (plVar21[1].prev != (lys_node *)0x0) {
      ly_ilo_change((ly_ctx *)0x0,ILO_IGNORE,&local_a8,(ly_err_item **)0x0);
      plVar22 = local_38->module;
      module_00 = (lys_module *)0x0;
      if ((plVar22 != (lys_module *)0x0) && (module_00 = plVar22, (plVar22->field_0x40 & 1) != 0)) {
        module_00 = (lys_module *)plVar22->data;
      }
      plVar21 = (lys_node *)transform_schema2json(module_00,(char *)local_38[1].prev);
      plVar9 = local_60;
      local_60[1].ext = (lys_ext_instance **)plVar21;
      ly_ilo_restore((ly_ctx *)0x0,local_a8,(ly_err_item *)0x0,0);
      plVar21 = local_38;
      if ((lys_node *)plVar9[1].ext == (lys_node *)0x0) {
        plVar21 = (lys_node *)lydict_insert(local_40,(char *)local_38[1].prev,0);
        local_60[1].ext = (lys_ext_instance **)plVar21;
        plVar21 = local_38;
      }
    }
    if ((lys_restr *)plVar21[1].dsc != (lys_restr *)0x0) {
      plVar13 = lys_restr_dup(local_48,(lys_restr *)plVar21[1].dsc,(uint)plVar21->padding[3],iVar7,
                              unres_00);
      local_60->must = plVar13;
      if (plVar13 == (lys_restr *)0x0) goto LAB_0015bf6f;
      local_60->unique_size = plVar21->padding[3];
    }
    if ((lys_when *)plVar21[1].name == (lys_when *)0x0) {
      return (lys_node *)child;
    }
    plVar14 = lys_when_dup(local_48,(lys_when *)plVar21[1].name,iVar7,unres_00);
    plVar9 = local_60;
LAB_0015b46f:
    plVar9->when = plVar14;
    goto LAB_0015bab2;
  case LYS_LEAFLIST:
    plStack_78 = (lys_node *)&local_70->tpdf;
    iVar8 = lys_ingrouping((lys_node *)child);
    local_50 = unres;
    iVar8 = lys_type_dup(plVar22,(lys_node *)child,(lys_type *)plStack_78,
                         (lys_type *)&plVar21[1].ref,iVar8,iVar7,unres);
    plVar21 = local_38;
    plVar22 = local_48;
    if (iVar8 != 0) goto LAB_0015bf6f;
    plVar16 = (lys_node *)lydict_insert(local_48->ctx,(char *)local_38[1].next,0);
    plVar9 = local_70;
    *(lys_node **)&local_70[1].flags = plVar16;
    *(undefined4 *)&local_70[1].iffeature = *(undefined4 *)&plVar21[1].priv;
    *(undefined4 *)((long)&local_70[1].iffeature + 4) = *(undefined4 *)((long)&plVar21[1].priv + 4);
    if ((lys_restr *)plVar21[1].dsc != (lys_restr *)0x0) {
      plVar13 = lys_restr_dup(plVar22,(lys_restr *)plVar21[1].dsc,(uint)plVar21->padding[3],iVar7,
                              local_50);
      plVar9->must = plVar13;
      if (plVar13 == (lys_restr *)0x0) goto LAB_0015bf6f;
      plVar9->unique_size = plVar21->padding[3];
    }
    if (plVar21[1].prev != (lys_node *)0x0) {
      bVar5 = plVar21->padding[2];
      plVar16 = (lys_node *)malloc((ulong)((uint)bVar5 * 8));
      plVar21 = local_38;
      local_70[1].ext = (lys_ext_instance **)plVar16;
      plVar25 = local_40;
      if (plVar16 == (lys_node *)0x0) goto LAB_0015bf66;
      local_70->keys_size = bVar5;
      for (uVar28 = 0; uVar28 < bVar5; uVar28 = uVar28 + 1) {
        pcVar11 = lydict_insert(local_40,*(char **)((plVar21[1].prev)->padding + uVar28 * 8 + -0x1c)
                                ,0);
        *(char **)(((lys_node *)local_70[1].ext)->padding + uVar28 * 8 + -0x1c) = pcVar11;
        bVar5 = local_70->keys_size;
      }
    }
    if ((lys_when *)plVar21[1].name == (lys_when *)0x0) {
      return (lys_node *)child;
    }
    plVar14 = lys_when_dup(local_48,(lys_when *)plVar21[1].name,iVar7,local_50);
    local_88 = local_70;
LAB_0015bd0e:
    local_88->when = plVar14;
    return (lys_node *)child;
  default:
    if (LVar2 == LYS_LIST) {
      local_68->min = *(uint32_t *)&plVar21[1].iffeature;
      local_68->max = *(uint32_t *)((long)&plVar21[1].iffeature + 4);
      if ((lys_restr *)plVar21[1].dsc != (lys_restr *)0x0) {
        plVar13 = lys_restr_dup(local_48,(lys_restr *)plVar21[1].dsc,(uint)plVar21->padding[0],iVar7
                                ,unres);
        plVar4->must = plVar13;
        if (plVar13 == (lys_restr *)0x0) goto LAB_0015bf6f;
        plVar4->must_size = plVar21->padding[0];
      }
      if ((ulong)plVar21->padding[2] != 0) {
        pplVar17 = (lys_node_leaf **)calloc((ulong)plVar21->padding[2],8);
        plVar21 = local_38;
        plVar9 = local_68;
        local_68->keys = pplVar17;
        plVar25 = local_40;
        if (pplVar17 == (lys_node_leaf **)0x0) goto LAB_0015bf66;
        pcVar11 = lydict_insert(local_40,(char *)local_38[1].module,0);
        plVar9->keys_str = pcVar11;
        bVar5 = plVar21->padding[2];
        plVar9->keys_size = bVar5;
        if (iVar7 == 0) {
          iVar8 = unres_schema_add_node(local_48,unres,plVar9,UNRES_LIST_KEYS,(lys_node *)0x0);
          plVar21 = local_38;
          if (iVar8 == -1) goto LAB_0015bf6f;
        }
        else {
          memcpy(plVar9->keys,*(void **)&plVar21[1].flags,(ulong)bVar5 << 3);
          plVar21 = local_38;
        }
      }
      if (plVar21[1].ext != (lys_ext_instance **)0x0) {
        bVar5 = plVar21->padding[3];
        local_50 = unres;
        plVar19 = (lys_unique *)malloc((ulong)bVar5 << 4);
        local_68->unique = plVar19;
        plVar25 = local_40;
        if (plVar19 == (lys_unique *)0x0) goto LAB_0015bf66;
        local_68->unique_size = bVar5;
        plVar16 = (lys_node *)0x0;
        while (plVar21 = local_98, unres = local_50, plVar16 < (lys_node *)(ulong)bVar5) {
          ppcVar20 = (char **)malloc((ulong)*(byte *)(local_98[1].ext + (long)plVar16 * 2 + 1) << 3)
          ;
          plVar25 = local_40;
          plVar19[(long)plVar16].expr = ppcVar20;
          if (ppcVar20 == (char **)0x0) goto LAB_0015bf66;
          bVar5 = *(byte *)(local_98[1].ext + (long)plVar16 * 2 + 1);
          plVar19[(long)plVar16].expr_size = bVar5;
          local_38 = plVar16;
          for (uVar28 = 0; uVar28 < bVar5; uVar28 = uVar28 + 1) {
            pcVar11 = lydict_insert(plVar25,(char *)(&local_98[1].ext[(long)plVar16 * 2]->def)
                                                    [uVar28],0);
            plVar9 = local_68;
            local_68->unique[(long)plVar16].expr[uVar28] = pcVar11;
            new_item = (undefined8 *)malloc(0x18);
            if (new_item == (undefined8 *)0x0) goto LAB_0015bf66;
            *new_item = plVar9;
            plVar19 = plVar9->unique;
            new_item[1] = plVar19[(long)plVar16].expr[uVar28];
            new_item[2] = &plVar19[(long)plVar16].trg_type;
            unres_schema_dup(local_48,local_50,&local_98,UNRES_LIST_UNIQ,new_item);
            plVar19 = plVar9->unique;
            bVar5 = plVar19[(long)plVar16].expr_size;
          }
          bVar5 = local_68->unique_size;
          iVar7 = local_54;
          plVar16 = (lys_node *)((long)&local_38->name + 1);
        }
      }
      if ((lys_when *)plVar21[1].name == (lys_when *)0x0) {
        return (lys_node *)child;
      }
      plVar14 = lys_when_dup(local_48,(lys_when *)plVar21[1].name,iVar7,unres);
      plVar9 = local_68;
      goto LAB_0015b46f;
    }
    if (LVar2 == LYS_ANYXML) {
LAB_0015b410:
      if ((lys_restr *)plVar21[1].dsc != (lys_restr *)0x0) {
        plVar13 = lys_restr_dup(plVar22,(lys_restr *)plVar21[1].dsc,(uint)plVar21->padding[3],iVar7,
                                unres);
        plVar9->must = plVar13;
        if (plVar13 == (lys_restr *)0x0) goto LAB_0015bf6f;
        plVar9->unique_size = plVar21->padding[3];
      }
      if ((lys_when *)plVar21[1].name == (lys_when *)0x0) {
        return (lys_node *)child;
      }
      plVar14 = lys_when_dup(plVar22,(lys_when *)plVar21[1].name,iVar7,unres);
      goto LAB_0015b46f;
    }
    if (LVar2 == LYS_CASE) {
      if (*(lys_when **)plVar21->hash == (lys_when *)0x0) {
        return (lys_node *)child;
      }
      plVar14 = lys_when_dup(plVar22,*(lys_when **)plVar21->hash,iVar7,unres);
      *(lys_when **)plVar10->hash = plVar14;
    }
    else {
      if (LVar2 == LYS_NOTIF) {
        return (lys_node *)child;
      }
      if (LVar2 == LYS_RPC) {
        return (lys_node *)child;
      }
      if (LVar2 == LYS_INPUT) {
        return (lys_node *)child;
      }
      if (LVar2 == LYS_OUTPUT) {
        return (lys_node *)child;
      }
      if (LVar2 != LYS_USES) {
        if (LVar2 == LYS_ACTION) {
          return (lys_node *)child;
        }
        if (LVar2 != LYS_ANYDATA) goto switchD_0015b697_caseD_3;
        goto LAB_0015b410;
      }
      plVar27->tpdf = (lys_tpdf *)plVar21[1].ref;
      if (*(lys_when **)plVar21->hash == (lys_when *)0x0) {
        return (lys_node *)child;
      }
      plVar14 = lys_when_dup(plVar22,*(lys_when **)plVar21->hash,iVar7,unres);
      *(lys_when **)plVar27->hash = plVar14;
    }
LAB_0015bab2:
    if (plVar14 != (lys_when *)0x0) {
      return (lys_node *)child;
    }
    goto LAB_0015bf6f;
  }
LAB_0015b1cc:
  ly_log(local_40,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
         "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
         ,uVar26);
LAB_0015bf6f:
  lys_node_free((lys_node *)child,(_func_void_lys_node_ptr_void_ptr *)0x0,0);
  return (lys_node *)0x0;
}

Assistant:

static struct lys_node *
lys_node_dup_recursion(struct lys_module *module, struct lys_node *parent, const struct lys_node *node,
                       struct unres_schema *unres, int shallow, int finalize)
{
    struct lys_node *retval = NULL, *iter, *p;
    struct ly_ctx *ctx = module->ctx;
    enum int_log_opts prev_ilo;
    int i, j, rc;
    unsigned int size, size1, size2;
    struct unres_list_uniq *unique_info;
    uint16_t flags;

    struct lys_node_container *cont = NULL;
    struct lys_node_container *cont_orig = (struct lys_node_container *)node;
    struct lys_node_choice *choice = NULL;
    struct lys_node_choice *choice_orig = (struct lys_node_choice *)node;
    struct lys_node_leaf *leaf = NULL;
    struct lys_node_leaf *leaf_orig = (struct lys_node_leaf *)node;
    struct lys_node_leaflist *llist = NULL;
    struct lys_node_leaflist *llist_orig = (struct lys_node_leaflist *)node;
    struct lys_node_list *list = NULL;
    struct lys_node_list *list_orig = (struct lys_node_list *)node;
    struct lys_node_anydata *any = NULL;
    struct lys_node_anydata *any_orig = (struct lys_node_anydata *)node;
    struct lys_node_uses *uses = NULL;
    struct lys_node_uses *uses_orig = (struct lys_node_uses *)node;
    struct lys_node_rpc_action *rpc = NULL;
    struct lys_node_inout *io = NULL;
    struct lys_node_notif *ntf = NULL;
    struct lys_node_case *cs = NULL;
    struct lys_node_case *cs_orig = (struct lys_node_case *)node;

    /* we cannot just duplicate memory since the strings are stored in
     * dictionary and we need to update dictionary counters.
     */

    switch (node->nodetype) {
    case LYS_CONTAINER:
        cont = calloc(1, sizeof *cont);
        retval = (struct lys_node *)cont;
        break;

    case LYS_CHOICE:
        choice = calloc(1, sizeof *choice);
        retval = (struct lys_node *)choice;
        break;

    case LYS_LEAF:
        leaf = calloc(1, sizeof *leaf);
        retval = (struct lys_node *)leaf;
        break;

    case LYS_LEAFLIST:
        llist = calloc(1, sizeof *llist);
        retval = (struct lys_node *)llist;
        break;

    case LYS_LIST:
        list = calloc(1, sizeof *list);
        retval = (struct lys_node *)list;
        break;

    case LYS_ANYXML:
    case LYS_ANYDATA:
        any = calloc(1, sizeof *any);
        retval = (struct lys_node *)any;
        break;

    case LYS_USES:
        uses = calloc(1, sizeof *uses);
        retval = (struct lys_node *)uses;
        break;

    case LYS_CASE:
        cs = calloc(1, sizeof *cs);
        retval = (struct lys_node *)cs;
        break;

    case LYS_RPC:
    case LYS_ACTION:
        rpc = calloc(1, sizeof *rpc);
        retval = (struct lys_node *)rpc;
        break;

    case LYS_INPUT:
    case LYS_OUTPUT:
        io = calloc(1, sizeof *io);
        retval = (struct lys_node *)io;
        break;

    case LYS_NOTIF:
        ntf = calloc(1, sizeof *ntf);
        retval = (struct lys_node *)ntf;
        break;

    default:
        LOGINT(ctx);
        goto error;
    }
    LY_CHECK_ERR_RETURN(!retval, LOGMEM(ctx), NULL);

    /*
     * duplicate generic part of the structure
     */
    retval->name = lydict_insert(ctx, node->name, 0);
    retval->dsc = lydict_insert(ctx, node->dsc, 0);
    retval->ref = lydict_insert(ctx, node->ref, 0);
    retval->flags = node->flags;

    retval->module = module;
    retval->nodetype = node->nodetype;

    retval->prev = retval;

    /* copying unresolved extensions is not supported */
    if (unres_schema_find(unres, -1, (void *)&node->ext, UNRES_EXT) == -1) {
        retval->ext_size = node->ext_size;
        if (lys_ext_dup(ctx, module, node->ext, node->ext_size, retval, LYEXT_PAR_NODE, &retval->ext, shallow, unres)) {
            goto error;
        }
    }

    if (node->iffeature_size) {
        retval->iffeature_size = node->iffeature_size;
        retval->iffeature = calloc(retval->iffeature_size, sizeof *retval->iffeature);
        LY_CHECK_ERR_GOTO(!retval->iffeature, LOGMEM(ctx), error);
    }

    if (!shallow) {
        for (i = 0; i < node->iffeature_size; ++i) {
            resolve_iffeature_getsizes(&node->iffeature[i], &size1, &size2);
            if (size1) {
                /* there is something to duplicate */

                /* duplicate compiled expression */
                size = (size1 / 4) + (size1 % 4) ? 1 : 0;
                retval->iffeature[i].expr = malloc(size * sizeof *retval->iffeature[i].expr);
                LY_CHECK_ERR_GOTO(!retval->iffeature[i].expr, LOGMEM(ctx), error);
                memcpy(retval->iffeature[i].expr, node->iffeature[i].expr, size * sizeof *retval->iffeature[i].expr);

                /* list of feature pointer must be updated to point to the resulting tree */
                retval->iffeature[i].features = calloc(size2, sizeof *retval->iffeature[i].features);
                LY_CHECK_ERR_GOTO(!retval->iffeature[i].features, LOGMEM(ctx); free(retval->iffeature[i].expr), error);

                for (j = 0; (unsigned int)j < size2; j++) {
                    rc = unres_schema_dup(module, unres, &node->iffeature[i].features[j], UNRES_IFFEAT,
                                          &retval->iffeature[i].features[j]);
                    if (rc == EXIT_FAILURE) {
                        /* feature is resolved in origin, so copy it
                         * - duplication is used for instantiating groupings
                         * and if-feature inside grouping is supposed to be
                         * resolved inside the original grouping, so we want
                         * to keep pointers to features from the grouping
                         * context */
                        retval->iffeature[i].features[j] = node->iffeature[i].features[j];
                    } else if (rc == -1) {
                        goto error;
                    } /* else unres was duplicated */
                }
            }

            /* duplicate if-feature's extensions */
            retval->iffeature[i].ext_size = node->iffeature[i].ext_size;
            if (lys_ext_dup(ctx, module, node->iffeature[i].ext, node->iffeature[i].ext_size,
                            &retval->iffeature[i], LYEXT_PAR_IFFEATURE, &retval->iffeature[i].ext, shallow, unres)) {
                goto error;
            }
        }

        /* inherit config flags */
        p = parent;
        do {
            for (iter = p; iter && (iter->nodetype == LYS_USES); iter = iter->parent);
        } while (iter && iter->nodetype == LYS_AUGMENT && (p = ((struct lys_node_augment *)iter)->target));
        if (iter) {
            flags = iter->flags & LYS_CONFIG_MASK;
        } else {
            /* default */
            flags = LYS_CONFIG_W;
        }

        switch (finalize) {
        case 1:
            /* inherit config flags */
            if (retval->flags & LYS_CONFIG_SET) {
                /* skip nodes with an explicit config value */
                if ((flags & LYS_CONFIG_R) && (retval->flags & LYS_CONFIG_W)) {
                    LOGVAL(ctx, LYE_INARG, LY_VLOG_LYS, retval, "true", "config");
                    LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "State nodes cannot have configuration nodes as children.");
                    goto error;
                }
                break;
            }

            if (retval->nodetype != LYS_USES) {
                retval->flags = (retval->flags & ~LYS_CONFIG_MASK) | flags;
            }

            /* inherit status */
            if ((parent->flags & LYS_STATUS_MASK) > (retval->flags & LYS_STATUS_MASK)) {
                /* but do it only in case the parent has a stonger status */
                retval->flags &= ~LYS_STATUS_MASK;
                retval->flags |= (parent->flags & LYS_STATUS_MASK);
            }
            break;
        case 2:
            /* erase config flags */
            retval->flags &= ~LYS_CONFIG_MASK;
            retval->flags &= ~LYS_CONFIG_SET;
            break;
        }

        /* connect it to the parent */
        if (lys_node_addchild(parent, retval->module, retval, 0)) {
            goto error;
        }

        /* go recursively */
        if (!(node->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
            LY_TREE_FOR(node->child, iter) {
                if (iter->nodetype & LYS_GROUPING) {
                    /* do not instantiate groupings */
                    continue;
                }
                if (!lys_node_dup_recursion(module, retval, iter, unres, 0, finalize)) {
                    goto error;
                }
            }
        }

        if (finalize == 1) {
            /* check that configuration lists have keys
             * - we really want to check keys_size in original node, because the keys are
             * not yet resolved here, it is done below in nodetype specific part */
            if ((retval->nodetype == LYS_LIST) && (retval->flags & LYS_CONFIG_W)
                    && !((struct lys_node_list *)node)->keys_size) {
                LOGVAL(ctx, LYE_MISSCHILDSTMT, LY_VLOG_LYS, retval, "key", "list");
                goto error;
            }
        }
    } else {
        memcpy(retval->iffeature, node->iffeature, retval->iffeature_size * sizeof *retval->iffeature);
    }

    /*
     * duplicate specific part of the structure
     */
    switch (node->nodetype) {
    case LYS_CONTAINER:
        if (cont_orig->when) {
            cont->when = lys_when_dup(module, cont_orig->when, shallow, unres);
            LY_CHECK_GOTO(!cont->when, error);
        }
        cont->presence = lydict_insert(ctx, cont_orig->presence, 0);

        if (cont_orig->must) {
            cont->must = lys_restr_dup(module, cont_orig->must, cont_orig->must_size, shallow, unres);
            LY_CHECK_GOTO(!cont->must, error);
            cont->must_size = cont_orig->must_size;
        }

        /* typedefs are not needed in instantiated grouping, nor the deviation's shallow copy */

        break;
    case LYS_CHOICE:
        if (choice_orig->when) {
            choice->when = lys_when_dup(module, choice_orig->when, shallow, unres);
            LY_CHECK_GOTO(!choice->when, error);
        }

        if (!shallow) {
            if (choice_orig->dflt) {
                rc = lys_get_sibling(choice->child, lys_node_module(retval)->name, 0, choice_orig->dflt->name, 0,
                                            LYS_ANYDATA | LYS_CASE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST,
                                            (const struct lys_node **)&choice->dflt);
                if (rc) {
                    if (rc == EXIT_FAILURE) {
                        LOGINT(ctx);
                    }
                    goto error;
                }
            } else {
                /* useless to check return value, we don't know whether
                * there really wasn't any default defined or it just hasn't
                * been resolved, we just hope for the best :)
                */
                unres_schema_dup(module, unres, choice_orig, UNRES_CHOICE_DFLT, choice);
            }
        } else {
            choice->dflt = choice_orig->dflt;
        }
        break;

    case LYS_LEAF:
        if (lys_type_dup(module, retval, &(leaf->type), &(leaf_orig->type), lys_ingrouping(retval), shallow, unres)) {
            goto error;
        }
        leaf->units = lydict_insert(module->ctx, leaf_orig->units, 0);

        if (leaf_orig->dflt) {
            /* transform into JSON format, may not be possible later */
            ly_ilo_change(NULL, ILO_IGNORE, &prev_ilo, NULL);
            leaf->dflt = transform_schema2json(lys_main_module(leaf_orig->module), leaf_orig->dflt);
            ly_ilo_restore(NULL, prev_ilo, NULL, 0);
            if (!leaf->dflt) {
                /* invalid identityref format or it was already transformed, so ignore the error here */
                leaf->dflt = lydict_insert(ctx, leaf_orig->dflt, 0);
            }
        }

        if (leaf_orig->must) {
            leaf->must = lys_restr_dup(module, leaf_orig->must, leaf_orig->must_size, shallow, unres);
            LY_CHECK_GOTO(!leaf->must, error);
            leaf->must_size = leaf_orig->must_size;
        }

        if (leaf_orig->when) {
            leaf->when = lys_when_dup(module, leaf_orig->when, shallow, unres);
            LY_CHECK_GOTO(!leaf->when, error);
        }
        break;

    case LYS_LEAFLIST:
        if (lys_type_dup(module, retval, &(llist->type), &(llist_orig->type), lys_ingrouping(retval), shallow, unres)) {
            goto error;
        }
        llist->units = lydict_insert(module->ctx, llist_orig->units, 0);

        llist->min = llist_orig->min;
        llist->max = llist_orig->max;

        if (llist_orig->must) {
            llist->must = lys_restr_dup(module, llist_orig->must, llist_orig->must_size, shallow, unres);
            LY_CHECK_GOTO(!llist->must, error);
            llist->must_size = llist_orig->must_size;
        }

        if (llist_orig->dflt) {
            llist->dflt = malloc(llist_orig->dflt_size * sizeof *llist->dflt);
            LY_CHECK_ERR_GOTO(!llist->dflt, LOGMEM(ctx), error);
            llist->dflt_size = llist_orig->dflt_size;

            for (i = 0; i < llist->dflt_size; i++) {
                llist->dflt[i] = lydict_insert(ctx, llist_orig->dflt[i], 0);
            }
        }

        if (llist_orig->when) {
            llist->when = lys_when_dup(module, llist_orig->when, shallow, unres);
        }
        break;

    case LYS_LIST:
        list->min = list_orig->min;
        list->max = list_orig->max;

        if (list_orig->must) {
            list->must = lys_restr_dup(module, list_orig->must, list_orig->must_size, shallow, unres);
            LY_CHECK_GOTO(!list->must, error);
            list->must_size = list_orig->must_size;
        }

        /* typedefs are not needed in instantiated grouping, nor the deviation's shallow copy */

        if (list_orig->keys_size) {
            list->keys = calloc(list_orig->keys_size, sizeof *list->keys);
            LY_CHECK_ERR_GOTO(!list->keys, LOGMEM(ctx), error);
            list->keys_str = lydict_insert(ctx, list_orig->keys_str, 0);
            list->keys_size = list_orig->keys_size;

            if (!shallow) {
                if (unres_schema_add_node(module, unres, list, UNRES_LIST_KEYS, NULL) == -1) {
                    goto error;
                }
            } else {
                memcpy(list->keys, list_orig->keys, list_orig->keys_size * sizeof *list->keys);
            }
        }

        if (list_orig->unique) {
            list->unique = malloc(list_orig->unique_size * sizeof *list->unique);
            LY_CHECK_ERR_GOTO(!list->unique, LOGMEM(ctx), error);
            list->unique_size = list_orig->unique_size;

            for (i = 0; i < list->unique_size; ++i) {
                list->unique[i].expr = malloc(list_orig->unique[i].expr_size * sizeof *list->unique[i].expr);
                LY_CHECK_ERR_GOTO(!list->unique[i].expr, LOGMEM(ctx), error);
                list->unique[i].expr_size = list_orig->unique[i].expr_size;
                for (j = 0; j < list->unique[i].expr_size; j++) {
                    list->unique[i].expr[j] = lydict_insert(ctx, list_orig->unique[i].expr[j], 0);

                    /* if it stays in unres list, duplicate it also there */
                    unique_info = malloc(sizeof *unique_info);
                    LY_CHECK_ERR_GOTO(!unique_info, LOGMEM(ctx), error);
                    unique_info->list = (struct lys_node *)list;
                    unique_info->expr = list->unique[i].expr[j];
                    unique_info->trg_type = &list->unique[i].trg_type;
                    unres_schema_dup(module, unres, &list_orig, UNRES_LIST_UNIQ, unique_info);
                }
            }
        }

        if (list_orig->when) {
            list->when = lys_when_dup(module, list_orig->when, shallow, unres);
            LY_CHECK_GOTO(!list->when, error);
        }
        break;

    case LYS_ANYXML:
    case LYS_ANYDATA:
        if (any_orig->must) {
            any->must = lys_restr_dup(module, any_orig->must, any_orig->must_size, shallow, unres);
            LY_CHECK_GOTO(!any->must, error);
            any->must_size = any_orig->must_size;
        }

        if (any_orig->when) {
            any->when = lys_when_dup(module, any_orig->when, shallow, unres);
            LY_CHECK_GOTO(!any->when, error);
        }
        break;

    case LYS_USES:
        uses->grp = uses_orig->grp;

        if (uses_orig->when) {
            uses->when = lys_when_dup(module, uses_orig->when, shallow, unres);
            LY_CHECK_GOTO(!uses->when, error);
        }
        /* it is not needed to duplicate refine, nor augment. They are already applied to the uses children */
        break;

    case LYS_CASE:
        if (cs_orig->when) {
            cs->when = lys_when_dup(module, cs_orig->when, shallow, unres);
            LY_CHECK_GOTO(!cs->when, error);
        }
        break;

    case LYS_ACTION:
    case LYS_RPC:
    case LYS_INPUT:
    case LYS_OUTPUT:
    case LYS_NOTIF:
        /* typedefs are not needed in instantiated grouping, nor the deviation's shallow copy */
        break;

    default:
        /* LY_NODE_AUGMENT */
        LOGINT(ctx);
        goto error;
    }

    return retval;

error:
    lys_node_free(retval, NULL, 0);
    return NULL;
}